

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.h
# Opt level: O2

void __thiscall pbrt::Half::Half(Half *this,float ff)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ushort uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  FP32 f;
  undefined1 in_register_00001204 [12];
  float fVar6;
  
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar1._4_12_ = in_register_00001204;
  auVar1._0_4_ = ff;
  auVar5 = vpandd_avx512vl(auVar1,auVar5);
  fVar6 = auVar5._0_4_;
  if ((uint)fVar6 < 0x47800000) {
    if ((uint)fVar6 < 0x38800000) {
      uVar3 = SUB42(fVar6 + 0.5,0);
    }
    else {
      uVar3 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd);
    }
  }
  else {
    uVar3 = (0x7f800000 < (uint)fVar6 | 0x3e) << 9;
  }
  auVar2._4_12_ = in_register_00001204;
  auVar2._0_4_ = ff;
  iVar4 = vmovmskps_avx(auVar2);
  this->h = (ushort)(iVar4 << 0xf) | uVar3;
  return;
}

Assistant:

PBRT_CPU_GPU
    explicit Half(float ff) {
#ifdef PBRT_IS_GPU_CODE
        h = __half_as_ushort(__float2half(ff));
#else
        // Rounding ties to nearest even instead of towards +inf
        FP32 f;
        f.f = ff;
        FP32 f32infty = {255 << 23};
        FP32 f16max = {(127 + 16) << 23};
        FP32 denorm_magic = {((127 - 15) + (23 - 10) + 1) << 23};
        unsigned int sign_mask = 0x80000000u;
        FP16 o = {0};

        unsigned int sign = f.u & sign_mask;
        f.u ^= sign;

        // NOTE all the integer compares in this function can be safely
        // compiled into signed compares since all operands are below
        // 0x80000000. Important if you want fast straight SSE2 code
        // (since there's no unsigned PCMPGTD).

        if (f.u >= f16max.u)  // result is Inf or NaN (all exponent bits set)
            o.u = (f.u > f32infty.u) ? 0x7e00 : 0x7c00;  // NaN->qNaN and Inf->Inf
        else {                                           // (De)normalized number or zero
            if (f.u < (113 << 23)) {  // resulting FP16 is subnormal or zero
                // use a magic value to align our 10 mantissa bits at the bottom
                // of the float. as long as FP addition is round-to-nearest-even
                // this just works.
                f.f += denorm_magic.f;

                // and one integer subtract of the bias later, we have our final
                // float!
                o.u = f.u - denorm_magic.u;
            } else {
                unsigned int mant_odd = (f.u >> 13) & 1;  // resulting mantissa is odd

                // update exponent, rounding bias part 1
                f.u += (uint32_t(15 - 127) << 23) + 0xfff;
                // rounding bias part 2
                f.u += mant_odd;
                // take the bits!
                o.u = f.u >> 13;
            }
        }

        o.u |= sign >> 16;
        h = o.u;
#endif
    }